

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_PrintInitStateInfo(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pLatch;
  uint uVar3;
  uint uVar4;
  int i;
  uint uVar5;
  
  uVar4 = 0;
  uVar5 = 0;
  uVar1 = 0;
  uVar3 = 0;
  i = 0;
  do {
    if (pNtk->vBoxes->nSize <= i) {
      printf("\tinitial states {0,1,x} = {%d, %d, %d}",(ulong)uVar4,(ulong)uVar5,(ulong)uVar1);
      if (uVar3 != 0) {
        printf(" + %d UNKNOWN",(ulong)uVar3);
      }
      putchar(10);
      return;
    }
    pLatch = Abc_NtkBox(pNtk,i);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      iVar2 = Abc_LatchIsInit0(pLatch);
      if (iVar2 == 0) {
        iVar2 = Abc_LatchIsInit1(pLatch);
        if (iVar2 == 0) {
          if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1aa,"int Abc_LatchIsInitDc(Abc_Obj_t *)");
          }
          if ((pLatch->field_5).pData == (void *)0x3) {
            uVar1 = uVar1 + 1;
          }
          else {
            uVar3 = uVar3 + 1;
          }
        }
        else {
          uVar5 = uVar5 + 1;
        }
      }
      else {
        uVar4 = uVar4 + 1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void
Abc_FlowRetime_PrintInitStateInfo( Abc_Ntk_t * pNtk ) {
  int i, n0=0, n1=0, nDC=0, nOther=0;
  Abc_Obj_t *pLatch;

  Abc_NtkForEachLatch( pNtk, pLatch, i ) {
    if (Abc_LatchIsInit0(pLatch)) n0++;
    else if (Abc_LatchIsInit1(pLatch)) n1++;
    else if (Abc_LatchIsInitDc(pLatch)) nDC++;
    else nOther++;
  }     

  printf("\tinitial states {0,1,x} = {%d, %d, %d}", n0, n1, nDC);
  if (nOther)
    printf(" + %d UNKNOWN", nOther);
  printf("\n");
}